

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O2

void __thiscall jsonip::semantic_state::new_null(semantic_state *this)

{
  pointer *pppVar1;
  pointer ppVar2;
  helper *phVar3;
  
  pre(this);
  ppVar2 = (this->state).
           super__Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  phVar3 = ppVar2[-1].second;
  (*phVar3->_vptr_helper[5])(phVar3,ppVar2 + -1);
  pppVar1 = &(this->state).
             super__Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *pppVar1 = *pppVar1 + -1;
  return;
}

Assistant:

void new_null()
        {
            pre();
            state.back().second->new_null(state.back().first);
            post();
        }